

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O3

string * __thiscall
cfd::core::WallyUtil::ConvertStringAndFree_abi_cxx11_
          (string *__return_storage_ptr__,WallyUtil *this,char *wally_string)

{
  allocator local_38 [24];
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,local_38);
  wally_free_string((char *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string WallyUtil::ConvertStringAndFree(char* wally_string) {
  try {
    std::string result = std::string(wally_string);
    wally_free_string(wally_string);
    return result;
  } catch (const std::exception& except) {
    wally_free_string(wally_string);
    warn(CFD_LOG_SOURCE, "system error. except={}.", except.what());
    throw except;
  } catch (...) {
    wally_free_string(wally_string);
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}